

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

U32 FSE_bitCost(void *symbolTTPtr,U32 tableLog,U32 symbolValue,U32 accuracyLog)

{
  uint uVar1;
  U32 bitMultiplier;
  U32 normalizedDeltaFromThreshold;
  U32 deltaFromThreshold;
  U32 tableSize;
  U32 threshold;
  U32 minNbBits;
  FSE_symbolCompressionTransform *symbolTT;
  U32 accuracyLog_local;
  U32 symbolValue_local;
  U32 tableLog_local;
  void *symbolTTPtr_local;
  
  uVar1 = *(uint *)((long)symbolTTPtr + (ulong)symbolValue * 8 + 4) >> 0x10;
  return (uVar1 + 1) * (1 << ((byte)accuracyLog & 0x1f)) -
         (((uVar1 + 1) * 0x10000 -
           (*(int *)((long)symbolTTPtr + (ulong)symbolValue * 8 + 4) +
           (1 << ((byte)tableLog & 0x1f))) << ((byte)accuracyLog & 0x1f)) >> ((byte)tableLog & 0x1f)
         );
}

Assistant:

MEM_STATIC U32 FSE_bitCost(const void* symbolTTPtr, U32 tableLog, U32 symbolValue, U32 accuracyLog)
{
    const FSE_symbolCompressionTransform* symbolTT = (const FSE_symbolCompressionTransform*) symbolTTPtr;
    U32 const minNbBits = symbolTT[symbolValue].deltaNbBits >> 16;
    U32 const threshold = (minNbBits+1) << 16;
    assert(tableLog < 16);
    assert(accuracyLog < 31-tableLog);  /* ensure enough room for renormalization double shift */
    {   U32 const tableSize = 1 << tableLog;
        U32 const deltaFromThreshold = threshold - (symbolTT[symbolValue].deltaNbBits + tableSize);
        U32 const normalizedDeltaFromThreshold = (deltaFromThreshold << accuracyLog) >> tableLog;   /* linear interpolation (very approximate) */
        U32 const bitMultiplier = 1 << accuracyLog;
        assert(symbolTT[symbolValue].deltaNbBits + tableSize <= threshold);
        assert(normalizedDeltaFromThreshold <= bitMultiplier);
        return (minNbBits+1)*bitMultiplier - normalizedDeltaFromThreshold;
    }
}